

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O0

ArgSlot __thiscall
Inline::MapActuals(Inline *this,Instr *callInstr,Instr **argOuts,ArgSlot formalCount,Func *inlinee,
                  ProfileId callSiteId,bool *stackArgsArgOutExpanded,Instr **argOutsExtra,
                  ArgSlot maxParamCount)

{
  Func *pFVar1;
  code *pcVar2;
  ushort uVar3;
  AddrOpnd *src1Opnd;
  Instr *pIVar4;
  bool bVar5;
  IRType type;
  ArgSlot AVar6;
  int iVar7;
  int32 iVar8;
  uint uVar9;
  undefined4 *puVar10;
  SymOpnd *pSVar11;
  JITTimeFunctionBody *this_00;
  StackSym *pSVar12;
  ScriptContextInfo *pSVar13;
  undefined4 extraout_var;
  Opnd *src2Opnd;
  unsigned_short *puVar14;
  RegOpnd *pRVar15;
  Opnd *pOVar16;
  ArgSlot local_116;
  ArgSlot local_b2;
  int local_b0;
  int iStack_ac;
  ArgSlot i_1;
  IntConstOpnd *pIStack_a8;
  int32 count;
  IntConstOpnd *countOpnd;
  OpCode startCallOpCode;
  ArgSlot i;
  IntConstOpnd *pIStack_98;
  ArgSlot currentActual;
  IntConstOpnd *callSiteIdOpnd;
  AddrOpnd *local_88;
  Opnd *undefined;
  SymOpnd *newLinkOpnd;
  StackSym *newStackSym;
  Instr *pIStack_68;
  uint currentFormal;
  Instr *argFixupInstr;
  StackSym *sym;
  Instr *argInstr;
  int iStack_48;
  bool hasArgumentsAccess;
  uint fixupArgoutCount;
  uint inlineeFrameSlot;
  ArgSlot actualCount;
  Opnd *linkOpnd;
  Func *pFStack_30;
  ProfileId callSiteId_local;
  Func *inlinee_local;
  Instr **ppIStack_20;
  ArgSlot formalCount_local;
  Instr **argOuts_local;
  Instr *callInstr_local;
  Inline *this_local;
  
  linkOpnd._6_2_ = callSiteId;
  pFStack_30 = inlinee;
  inlinee_local._6_2_ = formalCount;
  ppIStack_20 = argOuts;
  argOuts_local = (Instr **)callInstr;
  callInstr_local = (Instr *)this;
  if (maxParamCount < formalCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x130d,"(formalCount <= maxParamCount)","formalCount <= maxParamCount");
    if (!bVar5) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  _inlineeFrameSlot = IR::Instr::GetSrc2((Instr *)argOuts_local);
  fixupArgoutCount._2_2_ = 0;
  *stackArgsArgOutExpanded = false;
  iStack_48 = this->currentInlineeFrameSlot + 2;
  argInstr._4_4_ = 0;
  if (pFStack_30 != (Func *)0x0) {
    argInstr._3_1_ = GetInlineeHasArgumentObject(this,pFStack_30);
    Func::SetHasUnoptimizedArgumentsAccess(pFStack_30,(bool)argInstr._3_1_);
  }
  bVar5 = IR::Opnd::IsSymOpnd(_inlineeFrameSlot);
  if (bVar5) {
    do {
      bVar5 = IR::Opnd::IsSymOpnd(_inlineeFrameSlot);
      if (!bVar5) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                           ,0x1321,"(linkOpnd->IsSymOpnd())","linkOpnd->IsSymOpnd()");
        if (!bVar5) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 0;
      }
      pSVar11 = IR::Opnd::AsSymOpnd(_inlineeFrameSlot);
      argFixupInstr = (Instr *)Sym::AsStackSym(pSVar11->m_sym);
      if (((ulong)argFixupInstr->m_prev & 1) == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                           ,0x1324,"(sym->m_isSingleDef)","sym->m_isSingleDef");
        if (!bVar5) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 0;
      }
      bVar5 = StackSym::IsArgSlotSym((StackSym *)argFixupInstr);
      if (!bVar5) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                           ,0x1325,"(sym->IsArgSlotSym())","sym->IsArgSlotSym()");
        if (!bVar5) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 0;
      }
      iVar7 = iStack_48;
      pIVar4 = argFixupInstr;
      *(uint *)&argFixupInstr->m_prev = *(uint *)&argFixupInstr->m_prev & 0xffffbfff | 0x4000;
      pFVar1 = this->topFunc;
      AVar6 = StackSym::GetArgSlotNum((StackSym *)argFixupInstr);
      Func::SetArgOffset(pFVar1,(StackSym *)pIVar4,(iVar7 + (uint)AVar6) * 8);
      sym = (StackSym *)argFixupInstr->globOptInstrString;
      if ((*(short *)&sym->m_tempNumberSym == 0x59) && (pFStack_30 != (Func *)0x0)) {
        bVar5 = Func::GetHasUnoptimizedArgumentsAccess(pFStack_30);
        if (!bVar5) {
          *(undefined2 *)&sym->m_tempNumberSym = 0x1ed;
        }
        this_00 = Func::GetJITFunctionBody(pFStack_30);
        bVar5 = JITTimeFunctionBody::IsAsmJsMode(this_00);
        if (!bVar5) {
          IR::Instr::GenerateBytecodeArgOutCapture((Instr *)sym);
        }
      }
      if ((pFStack_30 != (Func *)0x0) && (*(short *)&sym->m_tempNumberSym == 0x1f1)) {
        for (newStackSym._4_4_ = 1; newStackSym._4_4_ < inlinee_local._6_2_;
            newStackSym._4_4_ = newStackSym._4_4_ + 1) {
          AVar6 = StackSym::GetArgSlotNum((StackSym *)argFixupInstr);
          pSVar12 = StackSym::NewArgSlotSym(AVar6,*(Func **)&sym->m_offset,TyVar);
          *(uint *)&pSVar12->field_0x18 = *(uint *)&pSVar12->field_0x18 & 0xffffbfff | 0x4000;
          newLinkOpnd = (SymOpnd *)pSVar12;
          type = StackSym::GetType((StackSym *)argFixupInstr);
          undefined = &IR::SymOpnd::New(&pSVar12->super_Sym,type,*(Func **)&sym->m_offset)->
                       super_Opnd;
          pSVar13 = Func::GetScriptContextInfo(this->topFunc);
          iVar7 = (*pSVar13->_vptr_ScriptContextInfo[1])();
          local_88 = IR::AddrOpnd::New(CONCAT44(extraout_var,iVar7),AddrOpndKindDynamicVar,
                                       this->topFunc,true,(Var)0x0);
          callSiteIdOpnd._6_2_ = ValueType::Undefined.field_0;
          IR::Opnd::SetValueType(&local_88->super_Opnd,ValueType::Undefined);
          pOVar16 = undefined;
          src1Opnd = local_88;
          src2Opnd = IR::Instr::GetSrc2((Instr *)sym);
          pIStack_68 = IR::Instr::New(ArgOut_A_FixupForStackArgs,pOVar16,&src1Opnd->super_Opnd,
                                      src2Opnd,*(Func **)&sym->m_offset);
          IR::Instr::InsertBefore((Instr *)sym,pIStack_68);
          pSVar12 = sym;
          pOVar16 = IR::Instr::GetDst(pIStack_68);
          IR::Instr::ReplaceSrc2((Instr *)pSVar12,pOVar16);
          StackSym::IncrementArgSlotNum((StackSym *)argFixupInstr);
          iVar7 = iStack_48;
          pIVar4 = argFixupInstr;
          pFVar1 = *(Func **)&sym->m_offset;
          AVar6 = StackSym::GetArgSlotNum((StackSym *)argFixupInstr);
          Func::SetArgOffset(pFVar1,(StackSym *)pIVar4,(iVar7 + (uint)AVar6) * 8);
          IR::Instr::GenerateArgOutSnapshot(pIStack_68);
          argInstr._4_4_ = argInstr._4_4_ + 1;
        }
        pIStack_98 = IR::IntConstOpnd::New
                               ((ulong)linkOpnd._6_2_,TyUint16,*(Func **)&sym->m_offset,false);
        IR::Instr::ReplaceSrc1((Instr *)sym,&pIStack_98->super_Opnd);
        fixupArgoutCount._2_2_ = fixupArgoutCount._2_2_ - 1;
        *stackArgsArgOutExpanded = true;
      }
      fixupArgoutCount._2_2_ = fixupArgoutCount._2_2_ + 1;
      AVar6 = StackSym::GetArgSlotNum((StackSym *)argFixupInstr);
      countOpnd._6_2_ = AVar6 - 1;
      if (countOpnd._6_2_ < inlinee_local._6_2_) {
        if (0xe < countOpnd._6_2_) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar10 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                             ,0x1368,"(currentActual < Js::InlineeCallInfo::MaxInlineeArgoutCount)",
                             "currentActual < Js::InlineeCallInfo::MaxInlineeArgoutCount");
          if (!bVar5) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar10 = 0;
        }
        ppIStack_20[countOpnd._6_2_] = (Instr *)sym;
      }
      else if (*(short *)&sym->m_tempNumberSym != 0x1f1) {
        if (0xf < countOpnd._6_2_) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar10 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                             ,0x136f,"(currentActual <= Js::InlineeCallInfo::MaxInlineeArgoutCount)"
                             ,"currentActual <= Js::InlineeCallInfo::MaxInlineeArgoutCount");
          if (!bVar5) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar10 = 0;
        }
        if ((argOutsExtra != (Instr **)0x0) &&
           (argOutsExtra[countOpnd._6_2_] = (Instr *)sym, countOpnd._6_2_ < maxParamCount)) {
          ppIStack_20[countOpnd._6_2_] = (Instr *)0x0;
        }
      }
      _inlineeFrameSlot = IR::Instr::GetSrc2((Instr *)sym);
      bVar5 = IR::Opnd::IsSymOpnd(_inlineeFrameSlot);
    } while (bVar5);
    if (0xf < fixupArgoutCount._2_2_) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                         ,0x137e,"(actualCount <= Js::InlineeCallInfo::MaxInlineeArgoutCount)",
                         "actualCount <= Js::InlineeCallInfo::MaxInlineeArgoutCount");
      if (!bVar5) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 0;
    }
    for (countOpnd._4_2_ = 0; uVar3 = countOpnd._4_2_,
        puVar14 = min<unsigned_short>((unsigned_short *)((long)&fixupArgoutCount + 2),
                                      (unsigned_short *)((long)&inlinee_local + 6)),
        uVar3 < *puVar14; countOpnd._4_2_ = countOpnd._4_2_ + 1) {
      if (ppIStack_20[countOpnd._4_2_] == (Instr *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                           ,0x1382,"(argOuts[i])","argOuts[i]");
        if (!bVar5) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 0;
      }
    }
  }
  bVar5 = IR::Opnd::IsRegOpnd(_inlineeFrameSlot);
  if (!bVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,4999,"(linkOpnd->IsRegOpnd())","linkOpnd->IsRegOpnd()");
    if (!bVar5) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  pRVar15 = IR::Opnd::AsRegOpnd(_inlineeFrameSlot);
  if ((*(uint *)&pRVar15->m_sym->field_0x18 & 1) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,5000,"(linkOpnd->AsRegOpnd()->m_sym->m_isSingleDef)",
                       "linkOpnd->AsRegOpnd()->m_sym->m_isSingleDef");
    if (!bVar5) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  pRVar15 = IR::Opnd::AsRegOpnd(_inlineeFrameSlot);
  countOpnd._2_2_ = ((pRVar15->m_sym->field_5).m_instrDef)->m_opcode;
  if (countOpnd._2_2_ != StartCall) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x138a,"(startCallOpCode == Js::OpCode::StartCall)",
                       "startCallOpCode == Js::OpCode::StartCall");
    if (!bVar5) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  if ((*stackArgsArgOutExpanded & 1U) != 0) {
    pRVar15 = IR::Opnd::AsRegOpnd(_inlineeFrameSlot);
    pOVar16 = IR::Instr::GetSrc1((pRVar15->m_sym->field_5).m_instrDef);
    pIStack_a8 = IR::Opnd::AsIntConstOpnd(pOVar16);
    iVar8 = IR::IntConstOpnd::AsInt32(pIStack_a8);
    iStack_ac = argInstr._4_4_ + -1 + iVar8;
    IR::IntConstOpnd::SetValue(pIStack_a8,(long)iStack_ac);
    Func::EnsureCallSiteToArgumentsOffsetFixupMap((Func *)argOuts_local[4]);
    bVar5 = JsUtil::
            BaseDictionary<unsigned_short,_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::ContainsKey((BaseDictionary<unsigned_short,_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                           *)argOuts_local[4][1].m_next,(unsigned_short *)((long)&linkOpnd + 6));
    if (bVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                         ,0x139a,
                         "(!(callInstr->m_func->callSiteToArgumentsOffsetFixupMap->ContainsKey(callSiteId)))"
                         ,
                         "!(callInstr->m_func->callSiteToArgumentsOffsetFixupMap->ContainsKey(callSiteId))"
                        );
      if (!bVar5) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 0;
    }
    local_b0 = argInstr._4_4_ + -1;
    JsUtil::
    BaseDictionary<unsigned_short,_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::Add((BaseDictionary<unsigned_short,_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           *)argOuts_local[4][1].m_next,(unsigned_short *)((long)&linkOpnd + 6),&local_b0);
  }
  pRVar15 = IR::Opnd::AsRegOpnd(_inlineeFrameSlot);
  uVar9 = IR::Instr::GetArgOutCount((pRVar15->m_sym->field_5).m_instrDef,false);
  if (uVar9 != fixupArgoutCount._2_2_) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x139e,
                       "(linkOpnd->AsRegOpnd()->m_sym->m_instrDef->GetArgOutCount( false) == actualCount)"
                       ,
                       "linkOpnd->AsRegOpnd()->m_sym->m_instrDef->GetArgOutCount( false) == actualCount"
                      );
    if (!bVar5) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  pRVar15 = IR::Opnd::AsRegOpnd(_inlineeFrameSlot);
  *(uint *)&pRVar15->m_sym->field_0x18 = *(uint *)&pRVar15->m_sym->field_0x18 & 0xffffbfff | 0x4000;
  for (local_b2 = fixupArgoutCount._2_2_; local_b2 < inlinee_local._6_2_; local_b2 = local_b2 + 1) {
    ppIStack_20[local_b2] = (Instr *)0x0;
  }
  if ((*stackArgsArgOutExpanded & 1U) == 0) {
    local_116 = fixupArgoutCount._2_2_;
  }
  else {
    local_116 = *(ArgSlot *)((long)&argOuts_local[4][5].globOptInstrString + 4);
  }
  return local_116;
}

Assistant:

Js::ArgSlot
Inline::MapActuals(IR::Instr *callInstr, __out_ecount(maxParamCount) IR::Instr *argOuts[],
    Js::ArgSlot formalCount,
    Func* inlinee,
    Js::ProfileId callSiteId,
    bool *stackArgsArgOutExpanded,
    IR::Instr *argOutsExtra[],
    Js::ArgSlot maxParamCount /* = Js::InlineeCallInfo::MaxInlineeArgoutCount*/)
{
    AnalysisAssert(formalCount <= maxParamCount);

    IR::Opnd *linkOpnd = callInstr->GetSrc2();
    Js::ArgSlot actualCount = 0;

    *stackArgsArgOutExpanded = false;
    uint inlineeFrameSlot = currentInlineeFrameSlot + (Js::Constants::InlineeMetaArgCount - 1);
    uint fixupArgoutCount = 0;

    if (inlinee)
    {
        bool hasArgumentsAccess = this->GetInlineeHasArgumentObject(inlinee);
        inlinee->SetHasUnoptimizedArgumentsAccess(hasArgumentsAccess);
    }

    if (linkOpnd->IsSymOpnd())
    {
        IR::Instr *argInstr;
        do
        {
            Assert(linkOpnd->IsSymOpnd());
            StackSym *sym = linkOpnd->AsSymOpnd()->m_sym->AsStackSym();

            Assert(sym->m_isSingleDef);
            Assert(sym->IsArgSlotSym());
            sym->m_isInlinedArgSlot = true;
            this->topFunc->SetArgOffset(sym, (inlineeFrameSlot + sym->GetArgSlotNum()) * MachPtr);
            argInstr = sym->m_instrDef;
            if (argInstr->m_opcode == Js::OpCode::ArgOut_A)
            {
                if(inlinee)
                {
                    if (!inlinee->GetHasUnoptimizedArgumentsAccess())
                    {
                        // This allows us to markTemp the argOut source.
                        argInstr->m_opcode = Js::OpCode::ArgOut_A_Inline;
                    }
                    if (!inlinee->GetJITFunctionBody()->IsAsmJsMode())
                    {
                        argInstr->GenerateBytecodeArgOutCapture();
                    }
                }
            }

            // Expand
            //
            // s31 ArgOut_A s32
            // s30 ArgOut_A_FromStackArgs s31
            //
            // to
            //
            // s31 ArgOut_A(_Inline) s32
            // sXX ArgOut_A_FixupForStackArgs s31
            // .
            // .
            // s34 ArgOut_A_FixupForStackArgs sXX
            // s30 ArgOut_A_FromStackArgs s34

            if (inlinee && argInstr->m_opcode == Js::OpCode::ArgOut_A_FromStackArgs)
            {
                IR::Instr * argFixupInstr;
                for(uint currentFormal = 1; currentFormal < formalCount; currentFormal++)
                {
                    StackSym* newStackSym = StackSym::NewArgSlotSym(sym->GetArgSlotNum(), argInstr->m_func);
                    newStackSym->m_isInlinedArgSlot = true;

                    IR::SymOpnd * newLinkOpnd = IR::SymOpnd::New(newStackSym, sym->GetType(), argInstr->m_func);
                    IR::Opnd * undefined = IR::AddrOpnd::New(this->topFunc->GetScriptContextInfo()->GetUndefinedAddr(),
                                                IR::AddrOpndKindDynamicVar, this->topFunc, true);
                    undefined->SetValueType(ValueType::Undefined);

                    argFixupInstr = IR::Instr::New(Js::OpCode::ArgOut_A_FixupForStackArgs, newLinkOpnd, undefined, argInstr->GetSrc2(), argInstr->m_func);
                    argInstr->InsertBefore(argFixupInstr);
                    argInstr->ReplaceSrc2(argFixupInstr->GetDst());
                    sym->IncrementArgSlotNum();
                    argInstr->m_func->SetArgOffset(sym, (inlineeFrameSlot + sym->GetArgSlotNum()) * MachPtr);

                    argFixupInstr->GenerateArgOutSnapshot();
                    fixupArgoutCount++;
                }
                // Now that the arguments object has been expanded, we don't require the sym corresponding to it.
                IR::IntConstOpnd* callSiteIdOpnd = IR::IntConstOpnd::New(callSiteId, TyUint16, argInstr->m_func);
                argInstr->ReplaceSrc1(callSiteIdOpnd);
                // Don't count ArgOut_A_FromStackArgs as an actual, when it has been expanded
                --actualCount;
                *stackArgsArgOutExpanded = true;
            }
            ++actualCount;
            const Js::ArgSlot currentActual = sym->GetArgSlotNum() - 1;
            if (currentActual < formalCount)
            {
                Assert(currentActual < Js::InlineeCallInfo::MaxInlineeArgoutCount);
                argOuts[currentActual] = argInstr;
            }

            // We don't want to treat ArgOut_A_FromStackArgs as an actual arg.
            else if (argInstr->m_opcode != Js::OpCode::ArgOut_A_FromStackArgs)
            {
                Assert(currentActual <= Js::InlineeCallInfo::MaxInlineeArgoutCount);
                if(argOutsExtra)
                {
                    argOutsExtra[currentActual] = argInstr;
                    if (currentActual < maxParamCount)
                    {
                        __analysis_assume(currentActual < Js::InlineeCallInfo::MaxInlineeArgoutCount);
                        argOuts[currentActual] = nullptr;
                    }
                }
            }
            linkOpnd = argInstr->GetSrc2();
        }
        while (linkOpnd->IsSymOpnd());
#if DBG
        Assert(actualCount <= Js::InlineeCallInfo::MaxInlineeArgoutCount);
        for(Js::ArgSlot i = 0; i < min(actualCount, formalCount); ++i)
        {
#pragma prefast(suppress:6001)
            Assert(argOuts[i]);
        }
#endif
    }

    Assert(linkOpnd->IsRegOpnd());
    Assert(linkOpnd->AsRegOpnd()->m_sym->m_isSingleDef);
    Js::OpCode startCallOpCode = linkOpnd->AsRegOpnd()->m_sym->m_instrDef->m_opcode;
    Assert(startCallOpCode == Js::OpCode::StartCall);

    // Update the count in StartCall to reflect
    //  1. ArgOut_A_FromStackArgs is not an actual once it has been expanded.
    //  2. The expanded argouts (from ArgOut_A_FromStackArgs).
    //
    // Note that the StartCall will reflect the formal count only as of now; the actual count would be set during MapFormals
    if(*stackArgsArgOutExpanded)
    {
        // TODO: Is an underflow here intended, it triggers on test\inlining\OS_2733280.js
        IR::IntConstOpnd * countOpnd = linkOpnd->AsRegOpnd()->m_sym->m_instrDef->GetSrc1()->AsIntConstOpnd();
        int32 count = countOpnd->AsInt32();
        count += fixupArgoutCount - 1;
        countOpnd->SetValue(count);

        callInstr->m_func->EnsureCallSiteToArgumentsOffsetFixupMap();
        Assert(!(callInstr->m_func->callSiteToArgumentsOffsetFixupMap->ContainsKey(callSiteId)));
        callInstr->m_func->callSiteToArgumentsOffsetFixupMap->Add(callSiteId, fixupArgoutCount - 1);
    }

    Assert(linkOpnd->AsRegOpnd()->m_sym->m_instrDef->GetArgOutCount(/*getInterpreterArgOutCount*/ false) == actualCount);

    // Mark the StartCall's dst as an inlined arg slot as well so we know this is an inlined start call
    // and not adjust the stack height on x86
    linkOpnd->AsRegOpnd()->m_sym->m_isInlinedArgSlot = true;

    // Missing arguments...
    for (Js::ArgSlot i = actualCount; i < formalCount; i++)
    {
        argOuts[i] = nullptr;
    }

    // We may not know the exact number of actuals that "b" gets in a.b.apply just yet, since we have expanded the ArgOut_A_FromStackArgs based on the number of formals "b" accepts.
    // So, return the actualCount stored on the func if the ArgOut_A_FromStackArgs was expanded (and thus, the expanded argouts were accounted for in calculating the local actualCount)
    return *stackArgsArgOutExpanded ? callInstr->m_func->actualCount : actualCount;
}